

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O0

void lqUpdateForNewLocation(lqInternalDB *lq,lqClientProxy *object,float x,float y,float z)

{
  lqClientProxy **bin;
  lqClientProxy *in_RSI;
  lqInternalDB *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  lqClientProxy **newBin;
  
  bin = lqBinForLocation(in_RDI,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
  in_RSI->x = in_XMM0_Da;
  in_RSI->y = in_XMM1_Da;
  in_RSI->z = in_XMM2_Da;
  if (bin != in_RSI->bin) {
    lqRemoveFromBin(in_RSI);
    lqAddToBin(in_RSI,bin);
  }
  return;
}

Assistant:

void lqUpdateForNewLocation  (lqInternalDB* lq, 
			      lqClientProxy* object, 
			      float x, float y, float z)
{
    /* find bin for new location */
    lqClientProxy** newBin = lqBinForLocation (lq, x, y, z);

    /* store location in client object, for future reference */
    object->x = x;
    object->y = y;
    object->z = z;

    /* has object moved into a new bin? */
    if (newBin != object->bin)
    {
	lqRemoveFromBin (object);
 	lqAddToBin (object, newBin);
    }
}